

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

PromiseFulfillerPair<unsigned_int> * kj::newPromiseAndFulfiller<unsigned_int>(void)

{
  RefOrVoid<kj::_::WeakFulfiller<unsigned_int>_> params;
  Own<kj::_::PromiseNode> *pOVar1;
  uint *puVar2;
  Promise<unsigned_int> *pPVar3;
  Own<kj::_::WeakFulfiller<unsigned_int>_> *other;
  PromiseFulfillerPair<unsigned_int> *in_RDI;
  void *local_68;
  undefined1 local_60 [8];
  ReducePromises<unsigned_int> promise;
  Own<kj::_::AdapterPromiseNode<unsigned_int,_kj::_::PromiseAndFulfillerAdapter<unsigned_int>_>_>
  local_40;
  undefined1 local_30 [8];
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::WeakFulfiller<unsigned_int>_> wrapper;
  
  _::WeakFulfiller<unsigned_int>::make();
  params = Own<kj::_::WeakFulfiller<unsigned_int>_>::operator*
                     ((Own<kj::_::WeakFulfiller<unsigned_int>_> *)&intermediate.ptr);
  heap<kj::_::AdapterPromiseNode<unsigned_int,kj::_::PromiseAndFulfillerAdapter<unsigned_int>>,kj::_::WeakFulfiller<unsigned_int>&>
            ((kj *)&local_40,params);
  Own<kj::_::PromiseNode>::
  Own<kj::_::AdapterPromiseNode<unsigned_int,kj::_::PromiseAndFulfillerAdapter<unsigned_int>>,void>
            ((Own<kj::_::PromiseNode> *)local_30,&local_40);
  Own<kj::_::AdapterPromiseNode<unsigned_int,_kj::_::PromiseAndFulfillerAdapter<unsigned_int>_>_>::
  ~Own(&local_40);
  pOVar1 = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)local_30);
  local_68 = (void *)0x0;
  puVar2 = implicitCast<unsigned_int*,decltype(nullptr)>(&local_68);
  pOVar1 = _::maybeChain<unsigned_int>(pOVar1,puVar2);
  Promise<unsigned_int>::Promise((Promise<unsigned_int> *)local_60,false,pOVar1);
  pPVar3 = mv<kj::Promise<unsigned_int>>((Promise<unsigned_int> *)local_60);
  Promise<unsigned_int>::Promise(&in_RDI->promise,pPVar3);
  other = mv<kj::Own<kj::_::WeakFulfiller<unsigned_int>>>
                    ((Own<kj::_::WeakFulfiller<unsigned_int>_> *)&intermediate.ptr);
  Own<kj::PromiseFulfiller<unsigned_int>>::Own<kj::_::WeakFulfiller<unsigned_int>,void>
            ((Own<kj::PromiseFulfiller<unsigned_int>> *)&in_RDI->fulfiller,other);
  Promise<unsigned_int>::~Promise((Promise<unsigned_int> *)local_60);
  Own<kj::_::PromiseNode>::~Own((Own<kj::_::PromiseNode> *)local_30);
  Own<kj::_::WeakFulfiller<unsigned_int>_>::~Own
            ((Own<kj::_::WeakFulfiller<unsigned_int>_> *)&intermediate.ptr);
  return in_RDI;
}

Assistant:

PromiseFulfillerPair<T> newPromiseAndFulfiller() {
  auto wrapper = _::WeakFulfiller<T>::make();

  Own<_::PromiseNode> intermediate(
      heap<_::AdapterPromiseNode<_::FixVoid<T>, _::PromiseAndFulfillerAdapter<T>>>(*wrapper));
  _::ReducePromises<T> promise(false,
      _::maybeChain(kj::mv(intermediate), implicitCast<T*>(nullptr)));

  return PromiseFulfillerPair<T> { kj::mv(promise), kj::mv(wrapper) };
}